

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnrichableI2cAnalyzer.cpp
# Opt level: O2

bool __thiscall
EnrichableI2cAnalyzer::GetBit(EnrichableI2cAnalyzer *this,BitState *bit_state,U64 *sck_rising_edge)

{
  AnalyzerChannelData *pAVar1;
  char cVar2;
  BitState BVar3;
  U64 UVar4;
  bool bVar5;
  
  AnalyzerChannelData::AdvanceToNextEdge();
  UVar4 = AnalyzerChannelData::GetSampleNumber();
  *sck_rising_edge = UVar4;
  AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)this->mSda);
  BVar3 = AnalyzerChannelData::GetBitState();
  *bit_state = BVar3;
  bVar5 = true;
  while( true ) {
    cVar2 = AnalyzerChannelData::DoMoreTransitionsExistInCurrentData();
    if (cVar2 != '\0') break;
    cVar2 = AnalyzerChannelData::DoMoreTransitionsExistInCurrentData();
    if (cVar2 != '\0') {
      cVar2 = AnalyzerChannelData::DoMoreTransitionsExistInCurrentData();
      if (cVar2 != '\0') break;
      AnalyzerChannelData::AdvanceToNextEdge();
      RecordStartStopBit(this);
      bVar5 = false;
    }
  }
  AnalyzerChannelData::AdvanceToNextEdge();
  while( true ) {
    pAVar1 = this->mSda;
    AnalyzerChannelData::GetSampleNumber();
    cVar2 = AnalyzerChannelData::WouldAdvancingToAbsPositionCauseTransition((ulonglong)pAVar1);
    if (cVar2 == '\0') break;
    AnalyzerChannelData::AdvanceToNextEdge();
    RecordStartStopBit(this);
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool EnrichableI2cAnalyzer::GetBit( BitState& bit_state, U64& sck_rising_edge )
{
	//SCL must be low coming into this function
	mScl->AdvanceToNextEdge(); //posedge
	sck_rising_edge = mScl->GetSampleNumber();
	mSda->AdvanceToAbsPosition( sck_rising_edge );  //data read on SCL posedge

	bit_state = mSda->GetBitState();
	bool result = true;

	//this while loop is only important if you need to be careful and check for things that that might happen at the very end of a data set, and you don't want to get stuck waithing on a channel that never changes.
	while( mScl->DoMoreTransitionsExistInCurrentData() == false )
	{
		// there are no more SCL transtitions, at least yet.
		if( mSda->DoMoreTransitionsExistInCurrentData() == true )
		{
			//there ARE some SDA transtions, let's double check to make sure there's still no SDA activity
			if( mScl->DoMoreTransitionsExistInCurrentData() == true )
				break;

			//ok, for sure we can advance to the next SDA edge without running past any SCL events.
			mSda->AdvanceToNextEdge();
			RecordStartStopBit();
			result = false;
			//return result;
		}
	}

	mScl->AdvanceToNextEdge(); //negedge; we'll leave the clock here
	while( mSda->WouldAdvancingToAbsPositionCauseTransition( mScl->GetSampleNumber() - 1 ) == true )
	{
		//clock is high -- SDA changes indicate start, stop, etc.
		mSda->AdvanceToNextEdge();
		RecordStartStopBit();
		result = false;
	}

	return result;
}